

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::mousePressEvent(QGraphicsView *this,QMouseEvent *event)

{
  QEventStorage<QMouseEvent> *this_00;
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  MouseEventSource source;
  MouseEventFlags flags;
  undefined8 uVar6;
  QWidget *pQVar7;
  QObject *pQVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  QPointF QVar12;
  undefined1 local_58 [12];
  char cStack_4c;
  undefined3 uStack_4b;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  *(uint *)(lVar1 + 0x300) = *(uint *)(lVar1 + 0x300) | 8;
  this_00 = (QEventStorage<QMouseEvent> *)(lVar1 + 0x410);
  if ((this_00 != (QEventStorage<QMouseEvent> *)event) || (*(char *)(lVar1 + 0x460) == '\0')) {
    QEventStorage<QMouseEvent>::store(this_00,event);
  }
  (**(code **)(*(long *)(lVar1 + 0x410) + 0x10))(this_00,0);
  if ((*(byte *)(lVar1 + 0x300) & 1) != 0) {
    auVar11 = QEventPoint::position();
    dVar10 = (double)((ulong)auVar11._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar11._0_8_;
    bVar3 = 2147483647.0 < dVar10;
    if (dVar10 <= -2147483648.0) {
      dVar10 = -2147483648.0;
    }
    dVar9 = (double)((ulong)auVar11._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar11._8_8_
    ;
    bVar4 = 2147483647.0 < dVar9;
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    *(ulong *)(lVar1 + 0x358) =
         CONCAT44((int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar9),
                  (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar10)
                 );
    QVar12 = mapToScene(this,(QPoint *)(lVar1 + 0x358));
    *(QPointF *)(lVar1 + 0x348) = QVar12;
    auVar11 = QEventPoint::globalPosition();
    dVar10 = (double)((ulong)auVar11._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar11._0_8_;
    bVar3 = 2147483647.0 < dVar10;
    if (dVar10 <= -2147483648.0) {
      dVar10 = -2147483648.0;
    }
    dVar9 = (double)((ulong)auVar11._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar11._8_8_
    ;
    bVar4 = 2147483647.0 < dVar9;
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    uVar6 = CONCAT44((int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 |
                                  ~-(ulong)bVar4 & (ulong)dVar9),
                     (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                  ~-(ulong)bVar3 & (ulong)dVar10));
    *(undefined8 *)(lVar1 + 0x360) = uVar6;
    *(undefined8 *)(lVar1 + 0x368) = *(undefined8 *)(lVar1 + 0x348);
    *(undefined8 *)(lVar1 + 0x370) = *(undefined8 *)(lVar1 + 0x350);
    *(undefined8 *)(lVar1 + 0x388) = uVar6;
    *(undefined4 *)(lVar1 + 0x398) = *(undefined4 *)(event + 0x40);
    if (((*(long *)(lVar1 + 0x490) != 0) && (*(int *)(*(long *)(lVar1 + 0x490) + 4) != 0)) &&
       (*(long *)(lVar1 + 0x498) != 0)) {
      local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
                ((QGraphicsSceneMouseEvent *)local_58,GraphicsSceneMousePress);
      pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_58,pQVar7);
      QGraphicsSceneMouseEvent::setButtonDownScenePos
                ((QGraphicsSceneMouseEvent *)local_58,*(MouseButton *)(lVar1 + 0x398),
                 (QPointF *)(lVar1 + 0x348));
      QGraphicsSceneMouseEvent::setButtonDownScreenPos
                ((QGraphicsSceneMouseEvent *)local_58,*(MouseButton *)(lVar1 + 0x398),
                 (QPoint *)(lVar1 + 0x360));
      QGraphicsSceneMouseEvent::setScenePos
                ((QGraphicsSceneMouseEvent *)local_58,(QPointF *)(lVar1 + 0x348));
      QGraphicsSceneMouseEvent::setScreenPos
                ((QGraphicsSceneMouseEvent *)local_58,(QPoint *)(lVar1 + 0x360));
      QGraphicsSceneMouseEvent::setLastScenePos
                ((QGraphicsSceneMouseEvent *)local_58,(QPointF *)(lVar1 + 0x368));
      QGraphicsSceneMouseEvent::setLastScreenPos
                ((QGraphicsSceneMouseEvent *)local_58,(QPoint *)(lVar1 + 0x388));
      QGraphicsSceneMouseEvent::setButtons
                ((QGraphicsSceneMouseEvent *)local_58,
                 (QFlagsStorageHelper<Qt::MouseButton,_4>)
                 *(QFlagsStorage<Qt::MouseButton> *)(event + 0x44));
      QGraphicsSceneMouseEvent::setButton
                ((QGraphicsSceneMouseEvent *)local_58,*(MouseButton *)(event + 0x40));
      QGraphicsSceneMouseEvent::setModifiers
                ((QGraphicsSceneMouseEvent *)local_58,
                 (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                 *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20));
      source = QMouseEvent::source();
      QGraphicsSceneMouseEvent::setSource((QGraphicsSceneMouseEvent *)local_58,source);
      flags.super_QFlagsStorageHelper<Qt::MouseEventFlag,_4>.super_QFlagsStorage<Qt::MouseEventFlag>
      .i = (QFlagsStorageHelper<Qt::MouseEventFlag,_4>)QMouseEvent::flags();
      QGraphicsSceneMouseEvent::setFlags((QGraphicsSceneMouseEvent *)local_58,flags);
      cStack_4c = 0;
      QGraphicsSceneEvent::setTimestamp((QGraphicsSceneEvent *)local_58,*(quint64 *)(event + 0x18));
      lVar2 = *(long *)(lVar1 + 0x490);
      if (event[0xb] == (QMouseEvent)0x1) {
        if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
          pQVar8 = (QObject *)0x0;
        }
        else {
          pQVar8 = *(QObject **)(lVar1 + 0x498);
        }
        qt_sendSpontaneousEvent(pQVar8,(QEvent *)local_58);
      }
      else {
        if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
          pQVar8 = (QObject *)0x0;
        }
        else {
          pQVar8 = *(QObject **)(lVar1 + 0x498);
        }
        QCoreApplication::sendEvent(pQVar8,(QEvent *)local_58);
      }
      cVar5 = cStack_4c;
      (**(code **)(*(long *)event + 0x10))(event,cStack_4c);
      (**(code **)(*(long *)&this_00->field_0 + 0x10))(this_00,cVar5);
      QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
      if (cVar5 != '\0') goto LAB_006353de;
    }
  }
  if (*(int *)(lVar1 + 0x2fc) == 1) {
    if (*(int *)(event + 0x40) == 1) {
      event[0xc] = (QMouseEvent)0x1;
      *(byte *)(lVar1 + 0x301) = *(byte *)(lVar1 + 0x301) | 2;
      *(undefined4 *)(lVar1 + 0x4bc) = 0;
      pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QCursor::QCursor((QCursor *)local_58,ClosedHandCursor);
      QWidget::setCursor(pQVar7,(QCursor *)local_58);
      QCursor::~QCursor((QCursor *)local_58);
    }
  }
  else if (((*(int *)(lVar1 + 0x2fc) == 2) && (*(char *)(lVar1 + 0x4b0) == '\0')) &&
          ((*(byte *)(lVar1 + 0x300) & 1) != 0)) {
    event[0xc] = (QMouseEvent)0x1;
    *(undefined1 *)(lVar1 + 0x4b0) = 1;
    *(undefined8 *)(lVar1 + 0x4a0) = 0;
    *(undefined8 *)(lVar1 + 0x4a8) = 0xffffffffffffffff;
    if (((*(long *)(lVar1 + 0x490) != 0) && (*(int *)(*(long *)(lVar1 + 0x490) + 4) != 0)) &&
       (*(QGraphicsScene **)(lVar1 + 0x498) != (QGraphicsScene *)0x0)) {
      if (((byte)event[0x23] & 4) == 0) {
        *(undefined4 *)(lVar1 + 0x4b8) = 0;
        QGraphicsScene::clearSelection(*(QGraphicsScene **)(lVar1 + 0x498));
      }
      else {
        *(undefined4 *)(lVar1 + 0x4b8) = 1;
      }
    }
  }
LAB_006353de:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::mousePressEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);

    // Store this event for replaying, finding deltas, and for
    // scroll-dragging; even in non-interactive mode, scroll hand dragging is
    // allowed, so we store the event at the very top of this function.
    d->storeMouseEvent(event);
    d->lastMouseEvent->setAccepted(false);

    if (d->sceneInteractionAllowed) {
        // Store some of the event's button-down data.
        d->mousePressViewPoint = event->position().toPoint();
        d->mousePressScenePoint = mapToScene(d->mousePressViewPoint);
        d->mousePressScreenPoint = event->globalPosition().toPoint();
        d->lastMouseMoveScenePoint = d->mousePressScenePoint;
        d->lastMouseMoveScreenPoint = d->mousePressScreenPoint;
        d->mousePressButton = event->button();

        if (d->scene) {
            // Convert and deliver the mouse event to the scene.
            QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMousePress);
            mouseEvent.setWidget(viewport());
            mouseEvent.setButtonDownScenePos(d->mousePressButton, d->mousePressScenePoint);
            mouseEvent.setButtonDownScreenPos(d->mousePressButton, d->mousePressScreenPoint);
            mouseEvent.setScenePos(d->mousePressScenePoint);
            mouseEvent.setScreenPos(d->mousePressScreenPoint);
            mouseEvent.setLastScenePos(d->lastMouseMoveScenePoint);
            mouseEvent.setLastScreenPos(d->lastMouseMoveScreenPoint);
            mouseEvent.setButtons(event->buttons());
            mouseEvent.setButton(event->button());
            mouseEvent.setModifiers(event->modifiers());
            mouseEvent.setSource(event->source());
            mouseEvent.setFlags(event->flags());
            mouseEvent.setAccepted(false);
            mouseEvent.setTimestamp(event->timestamp());
            if (event->spontaneous())
                qt_sendSpontaneousEvent(d->scene, &mouseEvent);
            else
                QCoreApplication::sendEvent(d->scene, &mouseEvent);

            // Update the original mouse event accepted state.
            bool isAccepted = mouseEvent.isAccepted();
            event->setAccepted(isAccepted);

            // Update the last mouse event accepted state.
            d->lastMouseEvent->setAccepted(isAccepted);

            if (isAccepted)
                return;
        }
    }

#if QT_CONFIG(rubberband)
    if (d->dragMode == QGraphicsView::RubberBandDrag && !d->rubberBanding) {
        if (d->sceneInteractionAllowed) {
            // Rubberbanding is only allowed in interactive mode.
            event->accept();
            d->rubberBanding = true;
            d->rubberBandRect = QRect();
            if (d->scene) {
                bool extendSelection = (event->modifiers() & Qt::ControlModifier) != 0;

                if (extendSelection) {
                    d->rubberBandSelectionOperation = Qt::AddToSelection;
                } else {
                    d->rubberBandSelectionOperation = Qt::ReplaceSelection;
                    d->scene->clearSelection();
                }
            }
        }
    } else
#endif
        if (d->dragMode == QGraphicsView::ScrollHandDrag && event->button() == Qt::LeftButton) {
            // Left-button press in scroll hand mode initiates hand scrolling.
            event->accept();
            d->handScrolling = true;
            d->handScrollMotions = 0;
#ifndef QT_NO_CURSOR
            viewport()->setCursor(Qt::ClosedHandCursor);
#endif
        }
}